

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_expr.cpp
# Opt level: O2

bool __thiscall
nivalis::anon_unknown_3::Differentiator::diff
          (Differentiator *this,ASTNode **ast,uint32_t diff_arg_id)

{
  uint32_t opcode;
  uint uVar1;
  ASTNode *pAVar2;
  bool bVar3;
  bool bVar4;
  ASTNode *pAVar5;
  size_type sVar6;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *pvVar7;
  uint64_t uVar8;
  int64_t i;
  uint64_t uVar9;
  ulong uVar10;
  pointer pUVar11;
  _OpCode _Var12;
  _Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var13;
  size_type __new_size;
  ASTNode **ast_00;
  ASTNode *tmp_1;
  long lVar14;
  double dVar15;
  ASTNode *tmp;
  anon_union_8_3_343d95dd_for_ASTNode_1 aStack_b0;
  pointer local_a8;
  ASTNode *local_a0;
  ASTNode *tmp_2;
  uint64_t local_88;
  _Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_80;
  ulong local_78;
  vector<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
  *local_70;
  double local_68;
  ASTNode *tmp_4;
  pointer local_58;
  long local_50;
  long local_48;
  long local_40;
  ASTNode *elnbptr;
  
  ast_00 = &this->ast_root;
  if (ast != (ASTNode **)0x0) {
    ast_00 = ast;
  }
  pAVar2 = *ast_00;
  opcode = pAVar2->opcode;
  pAVar5 = pAVar2 + 1;
  *ast_00 = pAVar5;
  switch(opcode) {
  case 0x8000:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,unaryminus);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    goto LAB_001d0d17;
  case 0x8001:
  case 0x8005:
  case 0x8006:
  case 0x8007:
  case 0x8008:
  case 0x800e:
    pvVar7 = this->out;
    dVar15 = 0.0;
LAB_001cf69a:
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,dVar15);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    goto LAB_001cf6ef;
  case 0x8002:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    _Var12 = sgn;
    goto LAB_001d0895;
  case 0x8003:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,0.5);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,power);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    copy_ast(this,pAVar5,this->out);
    pvVar7 = this->out;
    dVar15 = -0.5;
    goto LAB_001d13a0;
  case 0x8004:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar7 = this->out;
    _Var12 = mul;
    goto LAB_001d0b74;
  case 0x8009:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar7 = this->out;
    _Var12 = expb;
    break;
  case 0x800a:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,0.6931471805599453);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    _Var12 = exp2b;
    break;
  case 0x800b:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,divi);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    dVar15 = 1.0;
    goto LAB_001d0b98;
  case 0x800c:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,divi);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,1.0);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    dVar15 = 2.302585092994046;
    goto LAB_001d0b98;
  case 0x800d:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,divi);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,1.0);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    dVar15 = 0.6931471805599453;
    goto LAB_001d0b98;
  case 0x800f:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar7 = this->out;
    _Var12 = cosb;
    break;
  case 0x8010:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,unaryminus);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    _Var12 = sinb;
    break;
  case 0x8011:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,power);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,cosb);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    copy_ast(this,pAVar5,this->out);
    pvVar7 = this->out;
    dVar15 = -2.0;
    goto LAB_001d13a0;
  case 0x8012:
  case 0x8013:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    if (opcode == 0x8013) {
      pvVar7 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&tmp,unaryminus);
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    }
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,divi);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,1.0);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,sqrtb);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    _Var12 = sub;
    goto LAB_001d069f;
  case 0x8014:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,divi);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,1.0);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    _Var12 = add;
LAB_001d069f:
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,_Var12);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,1.0);
LAB_001d0c6c:
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    _Var12 = sqrb;
    break;
  case 0x8015:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar7 = this->out;
    _Var12 = coshb;
    break;
  case 0x8016:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar7 = this->out;
    _Var12 = sinhb;
    break;
  case 0x8017:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,sub);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,1.0);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,sqrb);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    _Var12 = tanhb;
    break;
  case 0x8018:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,tgammab);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    copy_ast(this,pAVar5,this->out);
    goto LAB_001d0cca;
  case 0x8019:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
LAB_001d0cca:
    pvVar7 = this->out;
    _Var12 = digammab;
    break;
  case 0x801a:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar7 = this->out;
    _Var12 = trigammab;
    break;
  case 0x801b:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar7 = this->out;
    _Var12 = polygammab;
LAB_001d0b74:
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,_Var12);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    dVar15 = 2.0;
LAB_001d0b98:
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,dVar15);
    goto LAB_001d0ce3;
  case 0x801c:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (!bVar3) {
      return false;
    }
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,1.1283791670955126);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,expb);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,unaryminus);
    goto LAB_001d0c6c;
  case 0x801d:
    goto LAB_001d13d2;
  case 0x801e:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,sigmoidb);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    copy_ast(this,*ast_00,this->out);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,sub);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,1.0);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    _Var12 = sigmoidb;
    goto LAB_001d0a3b;
  case 0x801f:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    _Var12 = sigmoidb;
LAB_001d0895:
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,_Var12);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pAVar5 = *ast_00;
    pvVar7 = this->out;
LAB_001d08b2:
    copy_ast(this,pAVar5,pvVar7);
LAB_001d0d17:
    bVar3 = diff(this,ast_00,diff_arg_id);
    if (bVar3) {
      return true;
    }
LAB_001d13d2:
    return false;
  case 0x8020:
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    pvVar7 = this->out;
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,unaryminus);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    copy_ast(this,*ast_00,this->out);
    pvVar7 = this->out;
    _Var12 = gausspdfb;
LAB_001d0a3b:
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,_Var12);
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    copy_ast(this,*ast_00,this->out);
    goto LAB_001d0d17;
  default:
    uVar10 = (ulong)(opcode - 0x41);
    if (opcode - 0x41 < 0x25) {
      if ((0x1f800e0000U >> (uVar10 & 0x3f) & 1) == 0) {
        if ((0x18000UL >> (uVar10 & 0x3f) & 1) != 0) {
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,bnz);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,(uint)(opcode == 0x50) * 3 + le);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          tmp = *ast_00;
          copy_ast(this,tmp,this->out);
          skip_ast(&tmp);
          copy_ast(this,tmp,this->out);
          begin_thunk(this);
          bVar3 = diff(this,ast_00,diff_arg_id);
          if (!bVar3) {
            return false;
          }
          end_thunk(this);
          begin_thunk(this);
          bVar3 = diff(this,ast_00,diff_arg_id);
          if (bVar3) {
            end_thunk(this);
            return true;
          }
          return false;
        }
        if (uVar10 == 0) {
          tmp_2 = pAVar5;
          skip_ast(&tmp_2);
          bVar3 = ast_has_var(&tmp_2,this->var_addr);
          if (bVar3) {
            return false;
          }
          pAVar5 = *ast_00;
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          bVar3 = diff(this,ast_00,diff_arg_id);
          if (!bVar3) {
            return false;
          }
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,divi);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,1.0);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,logb);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          copy_ast(this,*ast_00,this->out);
          copy_ast(this,pAVar5,this->out);
          goto LAB_001cf6ef;
        }
        goto LAB_001cf6fc;
      }
LAB_001cf6bf:
      pvVar7 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&tmp,0.0);
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
      skip_ast(ast_00);
LAB_001cf6ef:
      skip_ast(ast_00);
      return true;
    }
LAB_001cf6fc:
    switch(opcode) {
    case 0:
      pvVar7 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&tmp,null);
      goto LAB_001d13cb;
    case 1:
      pvVar7 = this->out;
      dVar15 = 0.0;
      break;
    case 2:
      pvVar7 = this->out;
      if ((pAVar2->field_1).ref == this->var_addr) {
        dVar15 = 1.0;
      }
      else {
        dVar15 = 0.0;
      }
      Expr::ASTNode::ASTNode((ASTNode *)&tmp,dVar15);
      goto LAB_001d13cb;
    case 3:
      pvVar7 = this->out;
      if ((pAVar2->field_1).ref == (ulong)diff_arg_id) {
        dVar15 = 1.0;
      }
      else {
        dVar15 = 0.0;
      }
      break;
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xd:
    case 0xe:
    case 0xf:
      goto LAB_001d13d2;
    case 0xc:
      local_a0 = (ASTNode *)CONCAT44(local_a0._4_4_,diff_arg_id);
      uVar1 = (pAVar2->field_1).call_info[0];
      pUVar11 = (this->env).funcs.
                super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __new_size = pUVar11[uVar1].n_args;
      p_Var13 = &(this->vis_asts)._M_h;
      tmp = *(ASTNode **)
             &pUVar11[uVar1].expr.ast.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>;
      sVar6 = std::
              _Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(p_Var13,&tmp);
      if (sVar6 != 0) {
        return false;
      }
      tmp = (ASTNode *)0x0;
      aStack_b0.ref = 0;
      local_a8 = (pointer)0x0;
      std::
      vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
      ::resize((vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
                *)&tmp,__new_size);
      pUVar11 = pUVar11 + uVar1;
      pAVar5 = *ast_00;
      lVar14 = 0;
      local_88 = __new_size;
      while (bVar3 = __new_size != 0, __new_size = __new_size - 1, bVar3) {
        pAVar5 = copy_ast(this,pAVar5,
                          (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                          )((long)&tmp->opcode + lVar14));
        lVar14 = lVar14 + 0x18;
      }
      local_70 = &this->argv;
      std::
      vector<std::vector<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>,std::allocator<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>,std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>,std::allocator<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>>>
      ::
      emplace_back<std::vector<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>,std::allocator<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>>
                ((vector<std::vector<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>,std::allocator<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>,std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>,std::allocator<std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>>>>>
                  *)local_70,
                 (vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
                  *)&tmp);
      std::
      vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
      ::~vector((vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>
                 *)&tmp);
      uVar8 = local_88;
      local_80 = p_Var13;
      if (local_88 != 0) {
        pvVar7 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&tmp,add);
        p_Var13 = local_80;
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
      }
      tmp = *(ASTNode **)
             &(pUVar11->expr).ast.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl;
      tmp_2 = tmp;
      std::__detail::
      _Insert<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)p_Var13,&tmp_2);
      bVar3 = diff(this,&tmp,0xffffffff);
      if (!bVar3) {
        return false;
      }
      tmp_2 = *(ASTNode **)
               &(pUVar11->expr).ast.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl;
      local_58 = pUVar11;
      std::
      _Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase(p_Var13,&tmp_2);
      local_68 = (double)(uVar8 - 1);
      uVar10 = 0;
      while( true ) {
        if (uVar8 == uVar10) {
          std::
          vector<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
          ::pop_back(local_70);
          return true;
        }
        local_78 = uVar10;
        if (uVar10 < (ulong)local_68) {
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,add);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
        }
        pvVar7 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
        bVar3 = diff(this,ast_00,(uint32_t)local_a0);
        pUVar11 = local_58;
        p_Var13 = local_80;
        if (!bVar3) break;
        tmp = *(ASTNode **)
               &(local_58->expr).ast.
                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
                _M_impl;
        tmp_2 = tmp;
        std::__detail::
        _Insert<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
        ::insert((_Insert<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                  *)local_80,&tmp_2);
        uVar10 = local_78;
        bVar3 = diff(this,&tmp,(uint32_t)local_78);
        uVar8 = local_88;
        if (!bVar3) {
          return false;
        }
        tmp_2 = *(ASTNode **)
                 &(pUVar11->expr).ast.
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  ._M_impl;
        std::
        _Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::_M_erase(p_Var13,&tmp_2);
        uVar10 = uVar10 + 1;
      }
      return false;
    case 0x10:
      pvVar7 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&tmp,bnz);
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
      pAVar5 = copy_ast(this,*ast_00,this->out);
      *ast_00 = pAVar5;
      if (pAVar5->opcode != 8) {
        return false;
      }
      *ast_00 = pAVar5 + 1;
      begin_thunk(this);
      bVar3 = diff(this,ast_00,diff_arg_id);
      if (!bVar3) {
        return false;
      }
      end_thunk(this);
      pAVar5 = *ast_00;
      if (pAVar5->opcode != 9) {
        return false;
      }
      *ast_00 = pAVar5 + 1;
      if (pAVar5[1].opcode != 8) {
        return false;
      }
      *ast_00 = pAVar5 + 2;
      begin_thunk(this);
      bVar3 = diff(this,ast_00,diff_arg_id);
      if (!bVar3) {
        return false;
      }
      end_thunk(this);
      if ((*ast_00)->opcode != 9) {
        return false;
      }
      *ast_00 = *ast_00 + 1;
      return true;
    case 0x11:
      uVar8 = (pAVar2->field_1).ref;
      if (uVar8 == this->var_addr) {
        return false;
      }
      if (pAVar5->opcode != 1) {
        return false;
      }
      local_a0 = (ASTNode *)CONCAT44(local_a0._4_4_,diff_arg_id);
      uVar10 = (ulong)pAVar2[1].field_1.val;
      *ast_00 = pAVar2 + 2;
      if (pAVar2[2].opcode != 1) {
        return false;
      }
      p_Var13 = (_Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(long)pAVar2[2].field_1.val;
      *ast_00 = pAVar2 + 3;
      bVar3 = (long)uVar10 <= (long)p_Var13;
      if (pAVar2[3].opcode != 8) {
        return false;
      }
      local_78 = ((long)p_Var13 + (ulong)bVar3 * 2) - 1;
      *ast_00 = pAVar2 + 4;
      local_a8 = (pointer)0x0;
      tmp = (ASTNode *)0x0;
      aStack_b0.ref = 0;
      local_88 = uVar8;
      local_80 = p_Var13;
      do {
        if (local_78 == uVar10) {
          skip_ast(ast_00);
          goto LAB_001d1684;
        }
        tmp_4 = *ast_00;
        if (p_Var13 !=
            (_Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             *)uVar10) {
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp_2,add);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp_2);
          uVar8 = local_88;
          p_Var13 = local_80;
        }
        (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] = (double)(long)uVar10;
        if ((ASTNode *)aStack_b0.ref != tmp) {
          aStack_b0 = (anon_union_8_3_343d95dd_for_ASTNode_1)tmp;
        }
        ast_sub_var(&tmp_4,uVar8,(double)(long)uVar10,(AST *)&tmp);
        tmp_4 = tmp;
        bVar4 = diff(this,&tmp_4,(uint32_t)local_a0);
        uVar10 = uVar10 + (ulong)bVar3 * 2 + -1;
      } while (bVar4);
      goto LAB_001d16a2;
    case 0x12:
      uVar8 = (pAVar2->field_1).ref;
      if (uVar8 == this->var_addr) {
        return false;
      }
      if (pAVar5->opcode != 1) {
        return false;
      }
      local_70 = (vector<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>,_std::allocator<std::vector<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>,_std::allocator<std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>_>_>_>_>
                  *)(long)pAVar2[1].field_1.val;
      *ast_00 = pAVar2 + 2;
      if (pAVar2[2].opcode != 1) {
        return false;
      }
      local_a0 = (ASTNode *)CONCAT44(local_a0._4_4_,diff_arg_id);
      local_50 = (long)pAVar2[2].field_1.val;
      *ast_00 = pAVar2 + 3;
      local_80 = (_Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)((long)local_70 - local_50);
      local_a8 = (pointer)0x0;
      tmp = (ASTNode *)0x0;
      aStack_b0.ref = 0;
      if (pAVar2[3].opcode == 8) {
        uVar10 = (ulong)(local_80 ==
                         (_Hashtable<const_nivalis::Expr::ASTNode_*,_const_nivalis::Expr::ASTNode_*,_std::allocator<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Identity,_std::equal_to<const_nivalis::Expr::ASTNode_*>,_std::hash<const_nivalis::Expr::ASTNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)0x0 || (long)local_70 < local_50);
        local_78 = uVar10 * 2 - 1;
        local_48 = local_50 + uVar10 * 2 + -1;
        *ast_00 = pAVar2 + 4;
        local_58 = (pointer)((long)local_80 - local_78);
        local_88 = 0;
        lVar14 = (long)local_70;
        while (lVar14 != local_48) {
          if (lVar14 != local_50) {
            pvVar7 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&tmp_2,add);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp_2);
          }
          local_68 = (double)lVar14;
          local_40 = lVar14 + local_78;
          for (uVar9 = 0; (long)local_58 + uVar9 != 0; uVar9 = uVar9 + local_78) {
            if ((long)local_80 + uVar9 != 0) {
              pvVar7 = this->out;
              Expr::ASTNode::ASTNode((ASTNode *)&tmp_2,mul);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
              emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp_2);
            }
            if (local_88 == uVar9) {
              (this->env).vars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8] = local_68;
              if ((ASTNode *)aStack_b0.ref != tmp) {
                aStack_b0 = (anon_union_8_3_343d95dd_for_ASTNode_1)tmp;
              }
              tmp_2 = *ast_00;
              ast_sub_var(&tmp_2,uVar8,local_68,(AST *)&tmp);
              tmp_2 = tmp;
              bVar3 = diff(this,&tmp_2,(uint32_t)local_a0);
              if (!bVar3) goto LAB_001d16a2;
            }
            else {
              tmp_2 = *ast_00;
              ast_sub_var(&tmp_2,uVar8,(double)(long)((long)local_70 + uVar9),this->out);
            }
          }
          local_88 = local_88 + local_78;
          lVar14 = local_40;
        }
        skip_ast(ast_00);
LAB_001d1684:
        if ((*ast_00)->opcode == 9) {
          *ast_00 = *ast_00 + 1;
          std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                         *)&tmp);
          return true;
        }
      }
LAB_001d16a2:
      std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *
                    )&tmp);
      return false;
    default:
      if (opcode - 0x4000 < 5) goto LAB_001cf6bf;
      if (1 < opcode - 0x20) {
        if (opcode == 0x18) {
          skip_ast(ast_00);
          goto LAB_001d0d17;
        }
        if (opcode == 0x30) {
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,add);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          pAVar5 = *ast_00;
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          bVar3 = diff(this,ast_00,diff_arg_id);
          if (!bVar3) {
            return false;
          }
          copy_ast(this,*ast_00,this->out);
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          bVar3 = diff(this,ast_00,diff_arg_id);
          if (!bVar3) {
            return false;
          }
          pvVar7 = this->out;
          goto LAB_001d0cfb;
        }
        if (opcode == 0x31) {
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,divi);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,sub);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          pAVar2 = *ast_00;
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          bVar3 = diff(this,ast_00,diff_arg_id);
          if (!bVar3) {
            return false;
          }
          pAVar5 = *ast_00;
          local_a0 = pAVar2;
          copy_ast(this,pAVar5,this->out);
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          bVar3 = diff(this,ast_00,diff_arg_id);
          if (!bVar3) {
            return false;
          }
          copy_ast(this,local_a0,this->out);
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,sqrb);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          pvVar7 = this->out;
          goto LAB_001d0cfb;
        }
        if (opcode == 0x32) {
          bVar3 = diff(this,ast_00,diff_arg_id);
          if (!bVar3) {
            return false;
          }
          bVar3 = ast_has_var(ast_00,this->var_addr);
          if (bVar3) {
            return false;
          }
          return true;
        }
        if (opcode == 0x40) {
          tmp_4 = pAVar5;
          skip_ast(&tmp_4);
          pAVar2 = tmp_4;
          bVar3 = ast_has_var(&tmp_4,this->var_addr);
          pAVar5 = *ast_00;
          if (bVar3) {
            tmp = (ASTNode *)0x0;
            aStack_b0.ref = 0;
            local_a8 = (pointer)0x0;
            Expr::ASTNode::ASTNode((ASTNode *)&tmp_2,mul);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            emplace_back<nivalis::Expr::ASTNode>
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       &tmp,(ASTNode *)&tmp_2);
            copy_ast(this,pAVar2,
                     (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)&tmp
                    );
            Expr::ASTNode::ASTNode((ASTNode *)&tmp_2,logb);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            emplace_back<nivalis::Expr::ASTNode>
                      ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       &tmp,(ASTNode *)&tmp_2);
            copy_ast(this,pAVar5,
                     (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)&tmp
                    );
            skip_ast(ast_00);
            skip_ast(ast_00);
            pAVar5 = tmp;
            elnbptr = tmp;
            pvVar7 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&tmp_2,mul);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp_2);
            pvVar7 = this->out;
            Expr::ASTNode::ASTNode((ASTNode *)&tmp_2,expb);
            std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp_2);
            copy_ast(this,pAVar5,this->out);
            bVar3 = diff(this,&elnbptr,diff_arg_id);
            std::_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
            ~_Vector_base((_Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                           *)&tmp);
            if (!bVar3) {
              return false;
            }
            return true;
          }
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          bVar3 = diff(this,ast_00,diff_arg_id);
          if (!bVar3) {
            return false;
          }
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          copy_ast(this,*ast_00,this->out);
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,power);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          copy_ast(this,pAVar5,this->out);
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,sub);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          copy_ast(this,*ast_00,this->out);
          pvVar7 = this->out;
          dVar15 = 1.0;
          goto LAB_001cf69a;
        }
        if (opcode != 0x4005) {
          if (opcode != 0x4006) {
            return true;
          }
          tmp_2 = pAVar5;
          bVar3 = ast_has_var(&tmp_2,this->var_addr);
          if (bVar3) {
            return false;
          }
          pAVar5 = *ast_00;
          skip_ast(ast_00);
          local_a0 = *ast_00;
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          bVar3 = diff(this,ast_00,diff_arg_id);
          if (!bVar3) {
            return false;
          }
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,polygammab);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,add);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          copy_ast(this,pAVar5,this->out);
          pvVar7 = this->out;
          Expr::ASTNode::ASTNode((ASTNode *)&tmp,1.0);
          std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
          emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
          pvVar7 = this->out;
          pAVar5 = local_a0;
          goto LAB_001d0cfb;
        }
        tmp_2 = pAVar5;
        skip_ast(&tmp_2);
        local_a0 = tmp_2;
        pvVar7 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&tmp,add);
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
        pvVar7 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
        pvVar7 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
        pvVar7 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&tmp,betab);
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
        copy_ast(this,pAVar5,this->out);
        copy_ast(this,local_a0,this->out);
        pvVar7 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&tmp,sub);
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
        pvVar7 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&tmp,digammab);
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
        copy_ast(this,pAVar5,this->out);
        pvVar7 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&tmp,digammab);
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
        pvVar7 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&tmp,add);
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
        copy_ast(this,pAVar5,this->out);
        copy_ast(this,local_a0,this->out);
        bVar3 = diff(this,ast_00,diff_arg_id);
        if (!bVar3) {
          return false;
        }
        pvVar7 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
        pvVar7 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&tmp,mul);
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
        pvVar7 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&tmp,betab);
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
        copy_ast(this,pAVar5,this->out);
        pAVar2 = local_a0;
        copy_ast(this,local_a0,this->out);
        pvVar7 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&tmp,sub);
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
        pvVar7 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&tmp,digammab);
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
        copy_ast(this,pAVar2,this->out);
        pvVar7 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&tmp,digammab);
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
        pvVar7 = this->out;
        Expr::ASTNode::ASTNode((ASTNode *)&tmp,add);
        std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
        emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
        copy_ast(this,pAVar5,this->out);
        pvVar7 = this->out;
        pAVar5 = local_a0;
        goto LAB_001d08b2;
      }
      pvVar7 = this->out;
      Expr::ASTNode::ASTNode((ASTNode *)&tmp,opcode,0xffffffffffffffff);
      std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
      emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
      bVar3 = diff(this,ast_00,diff_arg_id);
      if (!bVar3) {
        return false;
      }
      goto LAB_001d0d17;
    }
LAB_001d13a0:
    Expr::ASTNode::ASTNode((ASTNode *)&tmp,dVar15);
LAB_001d13cb:
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
    emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
    return true;
  }
  Expr::ASTNode::ASTNode((ASTNode *)&tmp,_Var12);
LAB_001d0ce3:
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
  emplace_back<nivalis::Expr::ASTNode>(pvVar7,(ASTNode *)&tmp);
  pvVar7 = this->out;
LAB_001d0cfb:
  copy_ast(this,pAVar5,pvVar7);
LAB_001d13d2:
  return true;
}

Assistant:

bool diff(const Expr::ASTNode** ast = nullptr, uint32_t diff_arg_id = -1) {
        if (ast == nullptr) ast = &ast_root;
        using namespace OpCode;
        uint32_t opcode = (*ast)->opcode;
        // std::cout << opcode << " " << diff_arg_id << " " << out.size() << " :: ";
        // for (auto& i : out) { std::cout << i.opcode << " "; }
        // std::cout << "\n";
        ++*ast;
        switch(opcode) {
            case null: PUSH(null); break;
            case val: PUSH(0.); break;
            case ref: PUSH(((*ast)-1)->ref == var_addr ? 1. : 0.); break;
            case arg: PUSH(((*ast)-1)->ref == diff_arg_id ? 1. : 0.); break;
            case call:
                      {
                          uint32_t fid = ((*ast)-1)->call_info[0];
                          size_t n_args = env.funcs[fid].n_args;

                          const auto& fexpr = env.funcs[fid].expr;
                          if (vis_asts.count(&fexpr.ast[0])) {
                              // Prevent recursion/cycles
                              return false;
                          }
                          {
                              std::vector<Expr::AST> call_args;
                              call_args.resize(n_args);
                              const Expr::ASTNode* tmp = *ast;
                              for (size_t i = 0; i < n_args; ++i) {
                                  tmp = copy_ast(tmp, call_args[i]);
                              }
                              argv.push_back(std::move(call_args));
                          }
                          {
                              if (n_args > 0) out.push_back(add);
                              const Expr::ASTNode* f_astptr = &fexpr.ast[0];
                              vis_asts.insert(&fexpr.ast[0]);
                              if (!diff(&f_astptr)) {
                                  return false;
                              }
                              vis_asts.erase(&fexpr.ast[0]);
                          }
                          for (size_t i = 0; i < n_args; ++i) {
                              if (i < n_args - 1) out.push_back(add);
                              out.push_back(mul);
                              DIFF_NEXT;
                              const Expr::ASTNode* f_astptr = &fexpr.ast[0];
                              vis_asts.insert(&fexpr.ast[0]);
                              if (!diff(&f_astptr, (uint32_t)i)) return false;
                              vis_asts.erase(&fexpr.ast[0]);
                          }
                          argv.pop_back();
                      }
                      break;
            case bnz:
                      {
                          PUSH(bnz);
                          *ast = copy_ast(*ast, out);
                          if ((*ast)->opcode != thunk_ret) return false; ++*ast;
                          begin_thunk(); DIFF_NEXT; end_thunk();
                          if ((*ast)->opcode != thunk_jmp) return false; ++*ast;
                          if ((*ast)->opcode != thunk_ret) return false; ++*ast;
                          begin_thunk(); DIFF_NEXT; end_thunk();
                          if ((*ast)->opcode != thunk_jmp) return false; ++*ast;
                      }
                      break;
            case sums:
                      {
                          uint64_t var_id = ((*ast)-1)->ref;
                          // Can't diff wrt index
                          if (var_id == var_addr) return false;
                          // Index must be constant for derivative
                          if ((*ast)->opcode != val) return false;
                          int64_t a = static_cast<int64_t>((*ast)->val); ++*ast;
                          // Index must be constant for derivative
                          if ((*ast)->opcode != val) return false;
                          int64_t b = static_cast<int64_t>((*ast)->val); ++*ast;
                          int64_t step = (a <= b) ? 1 : -1; b += step;
                          if ((*ast)->opcode != thunk_ret) return false; ++*ast;
                          Expr::AST diff_tmp;
                          for (int64_t i = a; i != b; i += step) {
                              const Expr::ASTNode* tmp = *ast;
                              if (i + step != b) PUSH(OpCode::add);
                              env.vars[var_id] = static_cast<double>(i);
                              diff_tmp.clear();
                              ast_sub_var(&tmp, var_id, static_cast<double>(i), diff_tmp);
                              tmp = &diff_tmp[0];
                              if (!diff(&tmp, diff_arg_id)) return false;
                          }
                          skip_ast(ast);
                          if ((*ast)->opcode != thunk_jmp) return false; ++*ast;
                      }
                      break;
            case prods:
                      {
                          uint64_t var_id = ((*ast)-1)->ref;
                          // Can't diff wrt index
                          if (var_id == var_addr) return false;
                          // Index must be constant for derivative
                          if ((*ast)->opcode != val) return false;
                          int64_t a = static_cast<int64_t>((*ast)->val); ++*ast;
                          // Index must be constant for derivative
                          if ((*ast)->opcode != val) return false;
                          int64_t b = static_cast<int64_t>((*ast)->val); ++*ast;
                          int64_t step = (a <= b) ? 1 : -1; b += step;
                          Expr::AST diff_tmp;
                          if ((*ast)->opcode != thunk_ret) return false; ++*ast;
                          for (int64_t i = a; i != b; i += step) {
                              if (i + step != b) PUSH(OpCode::add);
                              for (int64_t j = a; j != b; j += step) {
                                  if (j + step != b) PUSH(OpCode::mul);
                                  if (j == i) {
                                      env.vars[var_id] = static_cast<double>(i);
                                      diff_tmp.clear();
                                      const Expr::ASTNode* tmp = *ast;
                                      ast_sub_var(&tmp, var_id, static_cast<double>(j), diff_tmp);
                                      tmp = &diff_tmp[0];
                                      if (!diff(&tmp, diff_arg_id)) return false;
                                  } else {
                                      const Expr::ASTNode* tmp2 = *ast;
                                      ast_sub_var(&tmp2, var_id, static_cast<double>(j), out);
                                  }
                              }
                          }
                          skip_ast(ast);
                          if ((*ast)->opcode != thunk_jmp) return false; ++*ast;
                      }
                      break;

            case bsel: skip_ast(ast); DIFF_NEXT; break;
            case add: case sub: PUSH(opcode); DIFF_NEXT; DIFF_NEXT; break;
            case mul: {
                          // Product rule
                          PUSH(add);
                          const Expr::ASTNode* tmp1 = *ast;
                          PUSH(mul); DIFF_NEXT; // df *
                          copy_ast(*ast, out); // g
                          PUSH(mul);
                          DIFF_NEXT;
                          copy_ast(tmp1, out); // + dg * f
                      }
                break;
            case divi: {
                          // Quotient rule
                          PUSH(divi); PUSH(sub);
                          const Expr::ASTNode* tmp1 = *ast, *tmp1b = *ast;
                          PUSH(mul); DIFF_NEXT;  // df *
                          const Expr::ASTNode* tmp2 = *ast;
                          copy_ast(tmp2, out);  // g
                          PUSH(mul); DIFF_NEXT; copy_ast(tmp1, out); // - dg * f
                          tmp1 = tmp1b;
                          PUSH(sqrb); copy_ast(tmp2, out); // / g^2
                      }
                      break;
            case mod:
                      DIFF_NEXT;
                      // Cannot take derivative wrt modulus
                      if (ast_has_var(ast, var_addr)) return false;
                      break;

            case power:
                      {
                          const Expr::ASTNode* tmp1 = *ast;
                          skip_ast(&tmp1);
                          const Expr::ASTNode* expon_pos = tmp1;
                          bool expo_nonconst = ast_has_var(&tmp1, var_addr);
                          if (expo_nonconst) {
                              const Expr::ASTNode* base_pos = *ast;
                              Expr::AST elnb;
                              elnb.push_back(mul);
                              copy_ast(expon_pos, elnb);
                              elnb.push_back(logb);
                              copy_ast(base_pos, elnb);
                              skip_ast(ast); skip_ast(ast);
                              const Expr::ASTNode* elnbptr = &elnb[0];
                              PUSH(mul); PUSH(expb);
                              copy_ast(elnbptr, out);
                              if (!diff(&elnbptr, diff_arg_id)) return false;
                          } else {
                              CHAIN_RULE(PUSH(mul);
                                      copy_ast(*ast, out);
                                      PUSH(power), // g(x) goes here
                                      PUSH(sub); copy_ast(*ast, out); PUSH(1.));
                              skip_ast(ast);
                          }
                      }
                      break;
            case logbase:
                      {
                          const Expr::ASTNode* tmp = *ast;
                          skip_ast(&tmp);
                          bool base_nonconst = ast_has_var(&tmp, var_addr);
                          // Cannot take derivative wrt base
                          if (base_nonconst) return false;
                          CHAIN_RULE(PUSH(divi);
                                  PUSH(1.0);PUSH(mul);
                                  PUSH(logb);
                                  copy_ast(*ast, out),);
                          skip_ast(ast);
                      }
                      break;
            case max: case min:
                      {
                          PUSH(bnz); PUSH(opcode == max ? ge : le);
                          const Expr::ASTNode* tmp = *ast;
                          copy_ast(tmp, out);
                          skip_ast(&tmp); copy_ast(tmp, out);
                          begin_thunk(); DIFF_NEXT; end_thunk();
                          begin_thunk(); DIFF_NEXT; end_thunk();
                          break;
                      }
            case land: case lor: case lxor: case gcd: case lcm: case choose: case fafact: case rifact:
            case lt: case le: case eq: case ne: case ge: case gt:
                      PUSH(0.0); skip_ast(ast); skip_ast(ast); // Integer functions: 0 derivative
                      break;
            case betab:
                      {
                          const Expr::ASTNode* tmp = *ast, *x_pos = *ast;
                          skip_ast(&tmp);
                          const Expr::ASTNode* y_pos = tmp;
                          PUSH(add);
                          PUSH(mul);
                          PUSH(mul);
                          PUSH(betab);
                          copy_ast(x_pos,out);
                          copy_ast(y_pos,out);
                          PUSH(sub);
                          PUSH(digammab); copy_ast(x_pos,out);
                          PUSH(digammab); PUSH(add);
                          copy_ast(x_pos,out); copy_ast(y_pos,out);
                          DIFF_NEXT;
                          PUSH(mul);
                          PUSH(mul);
                          PUSH(betab);
                          copy_ast(x_pos,out);
                          copy_ast(y_pos,out);
                          PUSH(sub);
                          PUSH(digammab); copy_ast(y_pos,out);
                          PUSH(digammab); PUSH(add); copy_ast(x_pos,out); copy_ast(y_pos,out);
                          DIFF_NEXT;
                      }
                      break;
            case polygammab:
                      {
                          const Expr::ASTNode* tmp1 = *ast;
                          bool idx_nonconst = ast_has_var(&tmp1, var_addr);
                          if (idx_nonconst) return false; // Can't differentiate wrt polygamma index
                          tmp1 = *ast;
                          skip_ast(ast);
                          CHAIN_RULE(PUSH(polygammab);
                                  PUSH(add);
                                  copy_ast(tmp1, out);
                                  PUSH(1.),);
                      }
                      break;
            case unaryminus: PUSH(unaryminus); DIFF_NEXT; break;
            case absb: {
                           PUSH(mul); PUSH(sgn);
                           copy_ast(*ast, out);
                           DIFF_NEXT;
                       }
                             break;
            case sqrtb: CHAIN_RULE(
                                PUSH(mul);
                                PUSH(0.5);
                                PUSH(power), // g(x) goes here
                                PUSH(-0.5)); break;
            case sqrb: CHAIN_RULE(PUSH(mul); PUSH(2.),); break;
            case lnot: case sgn: case floorb: case ceilb: case roundb: case factb:
                       PUSH(0.0); skip_ast(ast); break; // Integer functions; 0 derivative
            case expb: CHAIN_RULE(PUSH(expb),); break;
            case exp2b: CHAIN_RULE( PUSH(mul); PUSH(log(2.)); PUSH(exp2b),); break;
            case logb:  CHAIN_RULE(PUSH(divi);PUSH(1.0),); break;
            case log2b:  CHAIN_RULE(PUSH(divi);PUSH(1.0);PUSH(mul);PUSH(log(2));,); break;
            case log10b: CHAIN_RULE(PUSH(divi);PUSH(1.0);PUSH(mul);PUSH(log(10));,); break;
            case sinb:  CHAIN_RULE(PUSH(cosb),); break;
            case cosb:  CHAIN_RULE(PUSH(unaryminus); PUSH(sinb),); break;
            case tanb:  CHAIN_RULE(PUSH(power); PUSH(cosb);
                                ,PUSH(-2.)); break;
            case asinb: case acosb:
                        CHAIN_RULE(if (opcode == acosb) PUSH(unaryminus);
                                PUSH(divi); PUSH(1.);
                                PUSH(sqrtb); PUSH(sub); PUSH(1.); PUSH(sqrb),); break;
            case atanb:  CHAIN_RULE(PUSH(divi); PUSH(1.); PUSH(add); PUSH(1.); PUSH(sqrb),); break;
            case sinhb: CHAIN_RULE(PUSH(coshb),); break;
            case coshb: CHAIN_RULE(PUSH(sinhb),); break;
            case tanhb: CHAIN_RULE(PUSH(sub); PUSH(1.); PUSH(sqrb); PUSH(tanhb),); break;
            case tgammab:
                        {
                            const Expr::ASTNode* tmp = *ast;
                            out.push_back(mul); DIFF_NEXT;
                            PUSH(mul); PUSH(tgammab); copy_ast(tmp, out);
                            PUSH(digammab); copy_ast(tmp, out);
                        }
                        break;
            case digammab: CHAIN_RULE(PUSH(trigammab),); break;
            case trigammab: CHAIN_RULE(PUSH(polygammab); PUSH(2.),); break;
            case lgammab: CHAIN_RULE(PUSH(digammab),); break;
            case erfb:   CHAIN_RULE(
                                 PUSH(mul); PUSH(2.0 / sqrt(M_PI));
                                 PUSH(expb); PUSH(unaryminus); PUSH(sqrb),);
                         break;
            case sigmoidb: 
                         {
                            PUSH(mul);
                            PUSH(mul);
                            PUSH(sigmoidb);
                            copy_ast(*ast, out);
                            PUSH(sub);
                            PUSH(1.);
                            PUSH(sigmoidb);
                            copy_ast(*ast, out);
                            DIFF_NEXT;
                         }
                        ; 
                        break;
            case softplusb: 
                         {
                            PUSH(mul);
                            PUSH(sigmoidb);
                            copy_ast(*ast, out);
                            DIFF_NEXT;
                         }
                         break;

            case gausspdfb: 
                         {
                            PUSH(mul);
                            PUSH(mul);
                            PUSH(unaryminus);
                            copy_ast(*ast, out);
                            PUSH(gausspdfb);
                            copy_ast(*ast, out);
                            DIFF_NEXT;
                         }
                         break;

            case zetab:  return false; // Derivative not available
        }
        return true;
    }